

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O1

void __thiscall gmath::EstimatedPlane::computePlane(EstimatedPlane *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  iVar7 = this->n;
  if (2 < iVar7) {
    dVar15 = (double)iVar7;
    dVar1 = this->sxx;
    dVar2 = this->syy;
    dVar3 = this->sxy;
    dVar8 = this->sx;
    dVar9 = this->sy;
    dVar11 = -dVar3;
    dVar10 = dVar15 * dVar11 * dVar3 +
             -dVar1 * dVar9 * dVar9 +
             -dVar2 * dVar8 * dVar8 + dVar1 * dVar15 * dVar2 + (dVar8 + dVar8) * dVar9 * dVar3;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      dVar14 = dVar3 * dVar8 + -dVar1 * dVar9;
      dVar4 = this->sz;
      dVar5 = this->syz;
      dVar6 = this->sxz;
      auVar12._0_8_ =
           dVar4 * (dVar3 * dVar9 + -dVar2 * dVar8) +
           dVar6 * (dVar2 * dVar15 + -dVar9 * dVar9) + dVar5 * (dVar9 * dVar8 + dVar15 * dVar11);
      auVar12._8_8_ =
           dVar4 * dVar14 +
           dVar6 * (dVar9 * dVar8 + dVar11 * (double)iVar7) +
           dVar5 * (dVar1 * dVar15 + -dVar8 * dVar8);
      auVar13._8_8_ = dVar10;
      auVar13._0_8_ = dVar10;
      auVar13 = divpd(auVar12,auVar13);
      this->a = (double)auVar13._0_8_;
      this->b = (double)auVar13._8_8_;
      this->c = ((dVar3 * dVar11 + dVar1 * dVar2) * dVar4 +
                (dVar9 * dVar3 - dVar2 * dVar8) * dVar6 + dVar14 * dVar5) / dVar10;
    }
  }
  return;
}

Assistant:

void EstimatedPlane::computePlane()
{
  if (n >= 3)
  {
    double div=n*sxx*syy+2*sx*sy*sxy-syy*sx*sx-sxx*sy*sy-n*sxy*sxy;

    if (fabs(div) != 0)
    {
      a=(sxz*(n*syy-sy*sy)+syz*(sx*sy-n*sxy)+sz*(sxy*sy-sx*syy))/div;
      b=(sxz*(sx*sy-n*sxy)+syz*(n*sxx-sx*sx)+sz*(sx*sxy-sxx*sy))/div;
      c=(sxz*(sxy*sy-sx*syy)+syz*(sx*sxy-sxx*sy)+sz*(sxx*syy-sxy*sxy))/div;
    }
  }
}